

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  size_type *psVar1;
  char *pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string *in_RDI;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  FilePath output_name;
  FilePath result;
  
  if (FLAGS_gtest_output_abi_cxx11_ == (char *)0x0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    pcVar2 = strchr(FLAGS_gtest_output_abi_cxx11_,0x3a);
    if (pcVar2 == (char *)0x0) {
      UnitTest::GetInstance();
      std::__cxx11::string::string
                ((string *)&local_b0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,(allocator *)&local_f0);
      FilePath::FilePath((FilePath *)((long)&output_name.pathname_.field_2 + 8),&local_b0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"test_detail.xml","");
      FilePath::FilePath((FilePath *)&local_90,&local_d0);
      FilePath::ConcatPaths
                ((FilePath *)local_70,(FilePath *)((long)&output_name.pathname_.field_2 + 8),
                 (FilePath *)&local_90);
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if (local_70 != (undefined1  [8])&output_name.pathname_._M_string_length) {
        operator_delete((void *)local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((size_type *)output_name.pathname_.field_2._8_8_ != &result.pathname_._M_string_length) {
        operator_delete((void *)output_name.pathname_.field_2._8_8_);
      }
      paVar4 = &local_b0.field_2;
    }
    else {
      __s = pcVar2 + 1;
      psVar1 = &result.pathname_._M_string_length;
      output_name.pathname_.field_2._8_8_ = psVar1;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&output_name.pathname_.field_2 + 8),__s,pcVar2 + sVar3 + 1);
      FilePath::FilePath((FilePath *)local_70,(string *)((long)&output_name.pathname_.field_2 + 8));
      if ((size_type *)output_name.pathname_.field_2._8_8_ != psVar1) {
        operator_delete((void *)output_name.pathname_.field_2._8_8_);
      }
      if (*(char *)local_70 != '/') {
        UnitTest::GetInstance();
        std::__cxx11::string::string
                  ((string *)&local_90,
                   ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                   _M_dataplus._M_p,(allocator *)(result.pathname_.field_2._M_local_buf + 0xf));
        FilePath::FilePath((FilePath *)&local_b0,&local_90);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,__s,__s + sVar3);
        FilePath::FilePath((FilePath *)&local_d0,&local_f0);
        FilePath::ConcatPaths
                  ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)&local_b0,
                   (FilePath *)&local_d0);
        std::__cxx11::string::_M_assign((string *)local_70);
        if ((size_type *)output_name.pathname_.field_2._8_8_ != psVar1) {
          operator_delete((void *)output_name.pathname_.field_2._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if ((output_name.pathname_._M_dataplus._M_p == (pointer)0x0) ||
         (((char *)((long)local_70 + -1))[(long)output_name.pathname_._M_dataplus._M_p] != '/')) {
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
      }
      else {
        GetCurrentExecutableName();
        GetOutputFormat_abi_cxx11_();
        FilePath::GenerateUniqueFileName
                  ((FilePath *)((long)&output_name.pathname_.field_2 + 8),(FilePath *)local_70,
                   (FilePath *)&local_b0,local_90._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char*>();
        if ((size_type *)output_name.pathname_.field_2._8_8_ != psVar1) {
          operator_delete((void *)output_name.pathname_.field_2._8_8_);
        }
      }
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&output_name.pathname_._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
      operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
    }
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  const char* const gtest_output_flag = GTEST_FLAG(output).c_str();
  if (gtest_output_flag == NULL)
    return "";

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == NULL)
    return internal::FilePath::ConcatPaths(
        internal::FilePath(
            UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(kDefaultOutputFile)).string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    // TODO(wan@google.com): on Windows \some\path is not an absolute
    // path (as its meaning depends on the current drive), yet the
    // following logic for turning it into an absolute path is wrong.
    // Fix it.
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory())
    return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}